

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpnghandler.cpp
# Opt level: O2

void __thiscall QPngHandlerPrivate::readPngTexts(QPngHandlerPrivate *this,png_info *info)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  bool bVar4;
  QByteArrayView QVar5;
  QArrayDataPointer<char16_t> local_e8;
  QStringBuilder<QStringBuilder<QString_&,_QLatin1String>,_QString> local_c8;
  QByteArrayView local_98;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_68;
  int num_text;
  png_textp text_ptr;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  text_ptr = (png_textp)&DAT_aaaaaaaaaaaaaaaa;
  num_text = 0;
  png_get_text(this->png_ptr);
  while( true ) {
    bVar4 = num_text == 0;
    num_text = num_text + -1;
    if (bVar4) break;
    local_68.size = 0;
    local_88.size = 0;
    local_68.d = (Data *)0x0;
    local_68.ptr = (char16_t *)0x0;
    local_88.d = (Data *)0x0;
    local_88.ptr = (char16_t *)0x0;
    QByteArrayView::QByteArrayView<char_*,_true>(&local_98,&text_ptr->key);
    QVar5.m_data = (storage_type *)local_98.m_size;
    QVar5.m_size = (qsizetype)&local_c8;
    QString::fromLatin1(QVar5);
    qVar3 = local_68.size;
    pcVar2 = local_68.ptr;
    pDVar1 = local_68.d;
    local_68.d = (Data *)local_c8.a.a;
    local_68.ptr = (char16_t *)local_c8.a.b.m_size;
    local_c8.a.a = (QString *)pDVar1;
    local_c8.a.b.m_size = (qsizetype)pcVar2;
    local_68.size = (qsizetype)local_c8.a.b.m_data;
    local_c8.a.b.m_data = (char *)qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
    if (text_ptr->itxt_length == 0) {
      QString::fromLatin1((QString *)&local_c8,text_ptr->text,(long)(int)text_ptr->text_length);
    }
    else {
      QString::fromUtf8((QString *)&local_c8,text_ptr->text,(long)(int)text_ptr->itxt_length);
    }
    qVar3 = local_88.size;
    pcVar2 = local_88.ptr;
    pDVar1 = local_88.d;
    local_88.d = (Data *)local_c8.a.a;
    local_88.ptr = (char16_t *)local_c8.a.b.m_size;
    local_c8.a.a = (QString *)pDVar1;
    local_c8.a.b.m_size = (qsizetype)pcVar2;
    local_88.size = (qsizetype)local_c8.a.b.m_data;
    local_c8.a.b.m_data = (char *)qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
    if ((this->description).d.size != 0) {
      QString::append((QLatin1String *)&this->description);
    }
    QString::simplified_helper((QString *)&local_e8);
    local_c8.b.d.size = local_e8.size;
    local_c8.b.d.ptr = local_e8.ptr;
    local_c8.b.d.d = local_e8.d;
    local_c8.a.b.m_size = 2;
    local_c8.a.b.m_data = ": ";
    local_e8.d = (Data *)0x0;
    local_e8.ptr = (char16_t *)0x0;
    local_e8.size = 0;
    local_c8.a.a = (QString *)&local_68;
    ::operator+=(&this->description,&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8.b.d);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
    QList<QString>::emplaceBack<QString_const&>(&this->readTexts,(QString *)&local_68);
    QList<QString>::emplaceBack<QString_const&>(&this->readTexts,(QString *)&local_88);
    text_ptr = text_ptr + 1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPngHandlerPrivate::readPngTexts(png_info *info)
{
#ifndef QT_NO_IMAGEIO_TEXT_LOADING
    png_textp text_ptr;
    int num_text=0;
    png_get_text(png_ptr, info, &text_ptr, &num_text);

    while (num_text--) {
        QString key, value;
        key = QString::fromLatin1(text_ptr->key);
#if defined(PNG_iTXt_SUPPORTED)
        if (text_ptr->itxt_length) {
            value = QString::fromUtf8(text_ptr->text, int(text_ptr->itxt_length));
        } else
#endif
        {
            value = QString::fromLatin1(text_ptr->text, int(text_ptr->text_length));
        }
        if (!description.isEmpty())
            description += "\n\n"_L1;
        description += key + ": "_L1 + value.simplified();
        readTexts.append(key);
        readTexts.append(value);
        text_ptr++;
    }
#else
    Q_UNUSED(info);
#endif
}